

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::compound_stmt(analysis *this)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  TYPE TVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  analysis *in_RSI;
  bool bVar7;
  NodePtr NVar8;
  NodePtr tmp_ptr;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_in_ptr;
  NodePtr tmp_in_ptr_1;
  NodePtr local_128;
  TreeNode *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [32];
  TreeNode *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [32];
  element_type *local_b8;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80 [16];
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  
  local_108._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  local_b8 = (element_type *)&this->current_tab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8,(TreeNode **)this,
             (allocator<dh::TreeNode> *)local_70,(char (*) [3])"{}",(int *)local_108);
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_108);
  local_108._0_8_ = (ulong)(uint)local_108._4_4_ << 0x20;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_108);
  local_90._M_allocated_capacity = (size_type)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{","");
  match(in_RSI,(string *)&local_90);
  if ((char *)local_90._M_allocated_capacity != local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 != INT) {
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar4 != VOID) {
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 != FLOAT) {
        TVar4 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar4 != BOOLEAN) goto LAB_0011324b;
      }
    }
  }
  var_decl((analysis *)local_108);
  uVar3 = local_108._8_8_;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108._0_8_;
  _Var6._M_pi = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_108._0_8_ = (TreeNode *)0x0;
  local_108._8_8_ = (element_type *)0x0;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
LAB_0011324b:
  local_118 = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110._M_pi =
       local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
LAB_0011328c:
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 != INT) {
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar4 != VOID) {
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 != FLOAT) {
        TVar4 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar4 != BOOLEAN) goto LAB_00113302;
      }
    }
  }
  var_decl((analysis *)local_108);
  TreeNode::setSibling(local_118,(NodePtr *)local_108);
  local_118 = (TreeNode *)local_108._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_110,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  goto LAB_0011328c;
LAB_00113302:
  TreeNode::appendChild(*(TreeNode **)this,&local_128);
  _Var6._M_pi = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  bVar7 = true;
  if (TVar4 != BREAK) {
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar4 != RETURN) {
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 != IF) {
        TVar4 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar4 != CONTINUE) {
          TVar4 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar4 != FOR) {
            TVar4 = token::getType((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            if (TVar4 != WHILE) {
              TVar4 = token::getType((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              if (TVar4 != ID) {
                token::getVal_abi_cxx11_
                          ((string *)local_108,
                           (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                iVar5 = std::__cxx11::string::compare(local_108);
                if (iVar5 == 0) {
                  bVar2 = true;
                  bVar1 = false;
                  bVar7 = true;
                }
                else {
                  token::getVal_abi_cxx11_
                            ((string *)local_70,
                             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  iVar5 = std::__cxx11::string::compare(local_70);
                  bVar7 = iVar5 == 0;
                  bVar2 = true;
                  bVar1 = true;
                }
                goto LAB_0011338f;
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
  bVar1 = false;
LAB_0011338f:
  if ((bVar1) && ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10))) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((bVar2) && ((TreeNode *)local_108._0_8_ != (TreeNode *)(local_108 + 0x10))) {
    operator_delete((void *)local_108._0_8_);
  }
  if (bVar7) {
    stmt((analysis *)local_d8);
    uVar3 = local_d8._8_8_;
    local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_d8._0_8_;
    _Var6._M_pi = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    local_d8._0_8_ = (TreeNode *)0x0;
    local_d8._8_8_ = (element_type *)0x0;
    local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
    }
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  local_118 = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_110,
             &local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  do {
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    bVar7 = true;
    if (TVar4 == BREAK) {
LAB_00113485:
      bVar2 = false;
      bVar1 = false;
    }
    else {
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == RETURN) goto LAB_00113485;
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == IF) goto LAB_00113485;
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == CONTINUE) goto LAB_00113485;
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == FOR) goto LAB_00113485;
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == WHILE) goto LAB_00113485;
      TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar4 == ID) goto LAB_00113485;
      token::getVal_abi_cxx11_
                ((string *)local_d8,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar5 = std::__cxx11::string::compare((char *)local_d8);
      if (iVar5 == 0) {
        bVar2 = true;
        bVar1 = false;
        bVar7 = true;
      }
      else {
        token::getVal_abi_cxx11_
                  ((string *)&local_50,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        iVar5 = std::__cxx11::string::compare(local_50._M_local_buf);
        bVar7 = iVar5 == 0;
        bVar2 = true;
        bVar1 = true;
      }
    }
    if ((bVar1) && ((pointer)local_50._M_allocated_capacity != (pointer)&stack0xffffffffffffffc0)) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    if ((bVar2) && ((TreeNode *)local_d8._0_8_ != (TreeNode *)(local_d8 + 0x10))) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (!bVar7) {
      TreeNode::appendChild(*(TreeNode **)this,&local_128);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"}","");
      match(in_RSI,&local_b0);
      _Var6._M_pi = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
        _Var6._M_pi = extraout_RDX_00;
      }
      if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
        _Var6._M_pi = extraout_RDX_01;
      }
      if (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var6._M_pi = extraout_RDX_02;
      }
      NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var6._M_pi;
      NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (NodePtr)NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    stmt((analysis *)&local_e8);
    TreeNode::setSibling(local_118,(NodePtr *)&local_e8);
    local_118 = local_e8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_110,&local_e0);
    if ((element_type *)local_e0._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
  } while( true );
}

Assistant:

NodePtr analysis::compound_stmt()
{
#ifdef _DEBGU_
	::std::cout << "[DEBUG] in compound_stmt \n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("{}",tmp->getLineno());
	NodePtr tmp_ptr = nullptr;
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ComK);

	match("{");

	if ( tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		tmp_ptr = var_decl();
	}

	NodePtr tmp_cur_ptr = tmp_ptr;
	while(tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		NodePtr tmp_in_ptr = var_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	tmp_ptr = nullptr;
	if ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		tmp_ptr = stmt();
	}

	tmp_cur_ptr = tmp_ptr;
	while ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		NodePtr tmp_in_ptr = stmt();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	match("}");

	return ret;
}